

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIis.h
# Opt level: O1

void __thiscall HighsIis::~HighsIis(HighsIis *this)

{
  pointer pHVar1;
  pointer piVar2;
  
  pHVar1 = (this->info_).super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pHVar1 != (pointer)0x0) {
    operator_delete(pHVar1);
  }
  piVar2 = (this->row_bound_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  piVar2 = (this->col_bound_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  piVar2 = (this->row_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  piVar2 = (this->col_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
    return;
  }
  return;
}

Assistant:

HighsIis() {}